

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_groestl.c
# Opt level: O1

void RND512P(uint8_t *x,uint32_t *y,uint32_t r)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  uVar3 = *(uint *)x;
  *(uint *)x = uVar3 ^ r;
  *(uint *)(x + 8) = *(uint *)(x + 8) ^ r ^ 0x10;
  *(uint *)(x + 0x10) = *(uint *)(x + 0x10) ^ r ^ 0x20;
  *(uint *)(x + 0x18) = *(uint *)(x + 0x18) ^ r ^ 0x30;
  *(uint *)(x + 0x20) = *(uint *)(x + 0x20) ^ r ^ 0x40;
  *(uint *)(x + 0x28) = *(uint *)(x + 0x28) ^ r ^ 0x50;
  *(uint *)(x + 0x30) = *(uint *)(x + 0x30) ^ r ^ 0x60;
  *(uint32_t *)(x + 0x38) = r ^ *(uint *)(x + 0x38) ^ 0x70;
  uVar6 = (uint)*(undefined8 *)(T + (ulong)x[9] * 2);
  uVar8 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[9] * 2) >> 0x20);
  uVar1 = (uint)*(undefined8 *)(T + (ulong)x[0x12] * 2);
  uVar4 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x12] * 2) >> 0x20);
  uVar12 = (uint)*(undefined8 *)(T + (ulong)x[0x1b] * 2);
  uVar13 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x1b] * 2) >> 0x20);
  uVar10 = (uint)*(undefined8 *)(T + (ulong)x[0x2d] * 2);
  uVar11 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x2d] * 2) >> 0x20);
  uVar7 = (uint)*(undefined8 *)(T + (ulong)x[0x36] * 2);
  uVar9 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x36] * 2) >> 0x20);
  uVar2 = (uint)*(undefined8 *)(T + (ulong)x[0x3f] * 2);
  uVar5 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x3f] * 2) >> 0x20);
  *(ulong *)y = (CONCAT44(uVar2 << 0x18,uVar5 << 0x18) | CONCAT44(uVar5 >> 8,uVar2 >> 8)) ^
                (CONCAT44(uVar7 << 0x10,uVar9 << 0x10) | CONCAT44(uVar9 >> 0x10,uVar7 >> 0x10)) ^
                (CONCAT44(uVar10 << 8,uVar11 << 8) | CONCAT44(uVar11 >> 0x18,uVar10 >> 0x18)) ^
                CONCAT44((int)*(undefined8 *)(T + (ulong)x[0x24] * 2),
                         (int)((ulong)*(undefined8 *)(T + (ulong)x[0x24] * 2) >> 0x20)) ^
                (CONCAT44(uVar12 >> 8,uVar13 >> 8) | CONCAT44(uVar13 << 0x18,uVar12 << 0x18)) ^
                (CONCAT44(uVar1 >> 0x10,uVar4 >> 0x10) | CONCAT44(uVar4 << 0x10,uVar1 << 0x10)) ^
                (CONCAT44(uVar6 >> 0x18,uVar8 >> 0x18) | CONCAT44(uVar8 << 8,uVar6 << 8)) ^
                *(ulong *)(T + (ulong)((uVar3 ^ r) & 0xff) * 2);
  uVar5 = (uint)*(undefined8 *)(T + (ulong)x[0x11] * 2);
  uVar7 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x11] * 2) >> 0x20);
  uVar3 = (uint)*(undefined8 *)(T + (ulong)x[0x1a] * 2);
  uVar2 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x1a] * 2) >> 0x20);
  uVar11 = (uint)*(undefined8 *)(T + (ulong)x[0x23] * 2);
  uVar12 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x23] * 2) >> 0x20);
  uVar9 = (uint)*(undefined8 *)(T + (ulong)x[0x35] * 2);
  uVar10 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x35] * 2) >> 0x20);
  uVar6 = (uint)*(undefined8 *)(T + (ulong)x[0x3e] * 2);
  uVar8 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x3e] * 2) >> 0x20);
  uVar1 = (uint)*(undefined8 *)(T + (ulong)x[7] * 2);
  uVar4 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[7] * 2) >> 0x20);
  *(ulong *)(y + 2) =
       (CONCAT44(uVar1 << 0x18,uVar4 << 0x18) | CONCAT44(uVar4 >> 8,uVar1 >> 8)) ^
       (CONCAT44(uVar6 << 0x10,uVar8 << 0x10) | CONCAT44(uVar8 >> 0x10,uVar6 >> 0x10)) ^
       (CONCAT44(uVar9 << 8,uVar10 << 8) | CONCAT44(uVar10 >> 0x18,uVar9 >> 0x18)) ^
       CONCAT44((int)*(undefined8 *)(T + (ulong)x[0x2c] * 2),
                (int)((ulong)*(undefined8 *)(T + (ulong)x[0x2c] * 2) >> 0x20)) ^
       (CONCAT44(uVar11 >> 8,uVar12 >> 8) | CONCAT44(uVar12 << 0x18,uVar11 << 0x18)) ^
       (CONCAT44(uVar3 >> 0x10,uVar2 >> 0x10) | CONCAT44(uVar2 << 0x10,uVar3 << 0x10)) ^
       (CONCAT44(uVar5 >> 0x18,uVar7 >> 0x18) | CONCAT44(uVar7 << 8,uVar5 << 8)) ^
       *(ulong *)(T + (ulong)x[8] * 2);
  uVar5 = (uint)*(undefined8 *)(T + (ulong)x[0x19] * 2);
  uVar7 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x19] * 2) >> 0x20);
  uVar3 = (uint)*(undefined8 *)(T + (ulong)x[0x22] * 2);
  uVar2 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x22] * 2) >> 0x20);
  uVar11 = (uint)*(undefined8 *)(T + (ulong)x[0x2b] * 2);
  uVar12 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x2b] * 2) >> 0x20);
  uVar9 = (uint)*(undefined8 *)(T + (ulong)x[0x3d] * 2);
  uVar10 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x3d] * 2) >> 0x20);
  uVar6 = (uint)*(undefined8 *)(T + (ulong)x[6] * 2);
  uVar8 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[6] * 2) >> 0x20);
  uVar1 = (uint)*(undefined8 *)(T + (ulong)x[0xf] * 2);
  uVar4 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0xf] * 2) >> 0x20);
  *(ulong *)(y + 4) =
       (CONCAT44(uVar1 << 0x18,uVar4 << 0x18) | CONCAT44(uVar4 >> 8,uVar1 >> 8)) ^
       (CONCAT44(uVar6 << 0x10,uVar8 << 0x10) | CONCAT44(uVar8 >> 0x10,uVar6 >> 0x10)) ^
       (CONCAT44(uVar9 << 8,uVar10 << 8) | CONCAT44(uVar10 >> 0x18,uVar9 >> 0x18)) ^
       CONCAT44((int)*(undefined8 *)(T + (ulong)x[0x34] * 2),
                (int)((ulong)*(undefined8 *)(T + (ulong)x[0x34] * 2) >> 0x20)) ^
       (CONCAT44(uVar11 >> 8,uVar12 >> 8) | CONCAT44(uVar12 << 0x18,uVar11 << 0x18)) ^
       (CONCAT44(uVar3 >> 0x10,uVar2 >> 0x10) | CONCAT44(uVar2 << 0x10,uVar3 << 0x10)) ^
       (CONCAT44(uVar5 >> 0x18,uVar7 >> 0x18) | CONCAT44(uVar7 << 8,uVar5 << 8)) ^
       *(ulong *)(T + (ulong)x[0x10] * 2);
  uVar5 = (uint)*(undefined8 *)(T + (ulong)x[0x21] * 2);
  uVar7 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x21] * 2) >> 0x20);
  uVar3 = (uint)*(undefined8 *)(T + (ulong)x[0x2a] * 2);
  uVar2 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x2a] * 2) >> 0x20);
  uVar11 = (uint)*(undefined8 *)(T + (ulong)x[0x33] * 2);
  uVar12 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x33] * 2) >> 0x20);
  uVar9 = (uint)*(undefined8 *)(T + (ulong)x[5] * 2);
  uVar10 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[5] * 2) >> 0x20);
  uVar6 = (uint)*(undefined8 *)(T + (ulong)x[0xe] * 2);
  uVar8 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0xe] * 2) >> 0x20);
  uVar1 = (uint)*(undefined8 *)(T + (ulong)x[0x17] * 2);
  uVar4 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x17] * 2) >> 0x20);
  *(ulong *)(y + 6) =
       (CONCAT44(uVar1 << 0x18,uVar4 << 0x18) | CONCAT44(uVar4 >> 8,uVar1 >> 8)) ^
       (CONCAT44(uVar6 << 0x10,uVar8 << 0x10) | CONCAT44(uVar8 >> 0x10,uVar6 >> 0x10)) ^
       (CONCAT44(uVar9 << 8,uVar10 << 8) | CONCAT44(uVar10 >> 0x18,uVar9 >> 0x18)) ^
       CONCAT44((int)*(undefined8 *)(T + (ulong)x[0x3c] * 2),
                (int)((ulong)*(undefined8 *)(T + (ulong)x[0x3c] * 2) >> 0x20)) ^
       (CONCAT44(uVar11 >> 8,uVar12 >> 8) | CONCAT44(uVar12 << 0x18,uVar11 << 0x18)) ^
       (CONCAT44(uVar3 >> 0x10,uVar2 >> 0x10) | CONCAT44(uVar2 << 0x10,uVar3 << 0x10)) ^
       (CONCAT44(uVar5 >> 0x18,uVar7 >> 0x18) | CONCAT44(uVar7 << 8,uVar5 << 8)) ^
       *(ulong *)(T + (ulong)x[0x18] * 2);
  uVar5 = (uint)*(undefined8 *)(T + (ulong)x[0x29] * 2);
  uVar7 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x29] * 2) >> 0x20);
  uVar3 = (uint)*(undefined8 *)(T + (ulong)x[0x32] * 2);
  uVar2 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x32] * 2) >> 0x20);
  uVar11 = (uint)*(undefined8 *)(T + (ulong)x[0x3b] * 2);
  uVar12 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x3b] * 2) >> 0x20);
  uVar9 = (uint)*(undefined8 *)(T + (ulong)x[0xd] * 2);
  uVar10 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0xd] * 2) >> 0x20);
  uVar6 = (uint)*(undefined8 *)(T + (ulong)x[0x16] * 2);
  uVar8 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x16] * 2) >> 0x20);
  uVar1 = (uint)*(undefined8 *)(T + (ulong)x[0x1f] * 2);
  uVar4 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x1f] * 2) >> 0x20);
  *(ulong *)(y + 8) =
       (CONCAT44(uVar1 << 0x18,uVar4 << 0x18) | CONCAT44(uVar4 >> 8,uVar1 >> 8)) ^
       (CONCAT44(uVar6 << 0x10,uVar8 << 0x10) | CONCAT44(uVar8 >> 0x10,uVar6 >> 0x10)) ^
       (CONCAT44(uVar9 << 8,uVar10 << 8) | CONCAT44(uVar10 >> 0x18,uVar9 >> 0x18)) ^
       CONCAT44((int)*(undefined8 *)(T + (ulong)x[4] * 2),
                (int)((ulong)*(undefined8 *)(T + (ulong)x[4] * 2) >> 0x20)) ^
       (CONCAT44(uVar11 >> 8,uVar12 >> 8) | CONCAT44(uVar12 << 0x18,uVar11 << 0x18)) ^
       (CONCAT44(uVar3 >> 0x10,uVar2 >> 0x10) | CONCAT44(uVar2 << 0x10,uVar3 << 0x10)) ^
       (CONCAT44(uVar5 >> 0x18,uVar7 >> 0x18) | CONCAT44(uVar7 << 8,uVar5 << 8)) ^
       *(ulong *)(T + (ulong)x[0x20] * 2);
  uVar5 = (uint)*(undefined8 *)(T + (ulong)x[0x31] * 2);
  uVar7 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x31] * 2) >> 0x20);
  uVar3 = (uint)*(undefined8 *)(T + (ulong)x[0x3a] * 2);
  uVar2 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x3a] * 2) >> 0x20);
  uVar11 = (uint)*(undefined8 *)(T + (ulong)x[3] * 2);
  uVar12 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[3] * 2) >> 0x20);
  uVar9 = (uint)*(undefined8 *)(T + (ulong)x[0x15] * 2);
  uVar10 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x15] * 2) >> 0x20);
  uVar6 = (uint)*(undefined8 *)(T + (ulong)x[0x1e] * 2);
  uVar8 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x1e] * 2) >> 0x20);
  uVar1 = (uint)*(undefined8 *)(T + (ulong)x[0x27] * 2);
  uVar4 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x27] * 2) >> 0x20);
  *(ulong *)(y + 10) =
       (CONCAT44(uVar1 << 0x18,uVar4 << 0x18) | CONCAT44(uVar4 >> 8,uVar1 >> 8)) ^
       (CONCAT44(uVar6 << 0x10,uVar8 << 0x10) | CONCAT44(uVar8 >> 0x10,uVar6 >> 0x10)) ^
       (CONCAT44(uVar9 << 8,uVar10 << 8) | CONCAT44(uVar10 >> 0x18,uVar9 >> 0x18)) ^
       CONCAT44((int)*(undefined8 *)(T + (ulong)x[0xc] * 2),
                (int)((ulong)*(undefined8 *)(T + (ulong)x[0xc] * 2) >> 0x20)) ^
       (CONCAT44(uVar11 >> 8,uVar12 >> 8) | CONCAT44(uVar12 << 0x18,uVar11 << 0x18)) ^
       (CONCAT44(uVar3 >> 0x10,uVar2 >> 0x10) | CONCAT44(uVar2 << 0x10,uVar3 << 0x10)) ^
       (CONCAT44(uVar5 >> 0x18,uVar7 >> 0x18) | CONCAT44(uVar7 << 8,uVar5 << 8)) ^
       *(ulong *)(T + (ulong)x[0x28] * 2);
  uVar5 = (uint)*(undefined8 *)(T + (ulong)x[0x39] * 2);
  uVar7 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x39] * 2) >> 0x20);
  uVar3 = (uint)*(undefined8 *)(T + (ulong)x[2] * 2);
  uVar2 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[2] * 2) >> 0x20);
  uVar11 = (uint)*(undefined8 *)(T + (ulong)x[0xb] * 2);
  uVar12 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0xb] * 2) >> 0x20);
  uVar9 = (uint)*(undefined8 *)(T + (ulong)x[0x1d] * 2);
  uVar10 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x1d] * 2) >> 0x20);
  uVar6 = (uint)*(undefined8 *)(T + (ulong)x[0x26] * 2);
  uVar8 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x26] * 2) >> 0x20);
  uVar1 = (uint)*(undefined8 *)(T + (ulong)x[0x2f] * 2);
  uVar4 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x2f] * 2) >> 0x20);
  *(ulong *)(y + 0xc) =
       (CONCAT44(uVar1 << 0x18,uVar4 << 0x18) | CONCAT44(uVar4 >> 8,uVar1 >> 8)) ^
       (CONCAT44(uVar6 << 0x10,uVar8 << 0x10) | CONCAT44(uVar8 >> 0x10,uVar6 >> 0x10)) ^
       (CONCAT44(uVar9 << 8,uVar10 << 8) | CONCAT44(uVar10 >> 0x18,uVar9 >> 0x18)) ^
       CONCAT44((int)*(undefined8 *)(T + (ulong)x[0x14] * 2),
                (int)((ulong)*(undefined8 *)(T + (ulong)x[0x14] * 2) >> 0x20)) ^
       (CONCAT44(uVar11 >> 8,uVar12 >> 8) | CONCAT44(uVar12 << 0x18,uVar11 << 0x18)) ^
       (CONCAT44(uVar3 >> 0x10,uVar2 >> 0x10) | CONCAT44(uVar2 << 0x10,uVar3 << 0x10)) ^
       (CONCAT44(uVar5 >> 0x18,uVar7 >> 0x18) | CONCAT44(uVar7 << 8,uVar5 << 8)) ^
       *(ulong *)(T + (ulong)x[0x30] * 2);
  uVar5 = (uint)*(undefined8 *)(T + (ulong)x[1] * 2);
  uVar7 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[1] * 2) >> 0x20);
  uVar3 = (uint)*(undefined8 *)(T + (ulong)x[10] * 2);
  uVar2 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[10] * 2) >> 0x20);
  uVar11 = (uint)*(undefined8 *)(T + (ulong)x[0x13] * 2);
  uVar12 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x13] * 2) >> 0x20);
  uVar9 = (uint)*(undefined8 *)(T + (ulong)x[0x25] * 2);
  uVar10 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x25] * 2) >> 0x20);
  uVar6 = (uint)*(undefined8 *)(T + (ulong)x[0x2e] * 2);
  uVar8 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x2e] * 2) >> 0x20);
  uVar1 = (uint)*(undefined8 *)(T + (ulong)x[0x37] * 2);
  uVar4 = (uint)((ulong)*(undefined8 *)(T + (ulong)x[0x37] * 2) >> 0x20);
  *(ulong *)(y + 0xe) =
       (CONCAT44(uVar1 << 0x18,uVar4 << 0x18) | CONCAT44(uVar4 >> 8,uVar1 >> 8)) ^
       (CONCAT44(uVar6 << 0x10,uVar8 << 0x10) | CONCAT44(uVar8 >> 0x10,uVar6 >> 0x10)) ^
       (CONCAT44(uVar9 << 8,uVar10 << 8) | CONCAT44(uVar10 >> 0x18,uVar9 >> 0x18)) ^
       CONCAT44((int)*(undefined8 *)(T + (ulong)x[0x1c] * 2),
                (int)((ulong)*(undefined8 *)(T + (ulong)x[0x1c] * 2) >> 0x20)) ^
       (CONCAT44(uVar11 >> 8,uVar12 >> 8) | CONCAT44(uVar12 << 0x18,uVar11 << 0x18)) ^
       (CONCAT44(uVar3 >> 0x10,uVar2 >> 0x10) | CONCAT44(uVar2 << 0x10,uVar3 << 0x10)) ^
       (CONCAT44(uVar5 >> 0x18,uVar7 >> 0x18) | CONCAT44(uVar7 << 8,uVar5 << 8)) ^
       *(ulong *)(T + (ulong)x[0x38] * 2);
  return;
}

Assistant:

static void RND512P(uint8_t *x, uint32_t *y, uint32_t r) {
  uint32_t temp_v1, temp_v2, temp_upper_value, temp_lower_value, temp;
  uint32_t* x32 = (uint32_t*)x;
  x32[ 0] ^= 0x00000000^r;
  x32[ 2] ^= 0x00000010^r;
  x32[ 4] ^= 0x00000020^r;
  x32[ 6] ^= 0x00000030^r;
  x32[ 8] ^= 0x00000040^r;
  x32[10] ^= 0x00000050^r;
  x32[12] ^= 0x00000060^r;
  x32[14] ^= 0x00000070^r;
  COLUMN(x,y, 0,  0,  2,  4,  6,  9, 11, 13, 15, temp_v1, temp_v2, temp_upper_value, temp_lower_value, temp);
  COLUMN(x,y, 2,  2,  4,  6,  8, 11, 13, 15,  1, temp_v1, temp_v2, temp_upper_value, temp_lower_value, temp);
  COLUMN(x,y, 4,  4,  6,  8, 10, 13, 15,  1,  3, temp_v1, temp_v2, temp_upper_value, temp_lower_value, temp);
  COLUMN(x,y, 6,  6,  8, 10, 12, 15,  1,  3,  5, temp_v1, temp_v2, temp_upper_value, temp_lower_value, temp);
  COLUMN(x,y, 8,  8, 10, 12, 14,  1,  3,  5,  7, temp_v1, temp_v2, temp_upper_value, temp_lower_value, temp);
  COLUMN(x,y,10, 10, 12, 14,  0,  3,  5,  7,  9, temp_v1, temp_v2, temp_upper_value, temp_lower_value, temp);
  COLUMN(x,y,12, 12, 14,  0,  2,  5,  7,  9, 11, temp_v1, temp_v2, temp_upper_value, temp_lower_value, temp);
  COLUMN(x,y,14, 14,  0,  2,  4,  7,  9, 11, 13, temp_v1, temp_v2, temp_upper_value, temp_lower_value, temp);
}